

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncTraits.h
# Opt level: O0

int luabridge::detail::
    Invoke<char_const*,luabridge::detail::TypeList<char_const*,luabridge::detail::TypeList<bool,void>>,1>
    ::run<char_const*(*)(char_const*,bool)>(lua_State *L,_func_char_ptr_char_ptr_bool **fn)

{
  char *str;
  TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<bool,_void>_>_>
  *tvl;
  exception *e;
  undefined1 local_30 [8];
  ArgList<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<bool,_void>_>,_1>
  args;
  _func_char_ptr_char_ptr_bool **fn_local;
  lua_State *L_local;
  
  args.
  super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<bool,_void>_>_>
  ._8_8_ = fn;
  ArgList<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<bool,_void>_>,_1>::
  ArgList((ArgList<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<bool,_void>_>,_1>
           *)local_30,L);
  str = FuncTraits<const_char_*(*)(const_char_*,_bool),_const_char_*(*)(const_char_*,_bool)>::call
                  ((FuncTraits<const_char_*(*)(const_char_*,_bool),_const_char_*(*)(const_char_*,_bool)>
                    *)args.
                      super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<bool,_void>_>_>
                      ._8_8_,(DeclType *)local_30,tvl);
  Stack<const_char_*>::push(L,str);
  return 1;
}

Assistant:

static int run(lua_State* L, Fn& fn)
    {
        try
        {
            ArgList<Params, startParam> args(L);
            Stack<ReturnType>::push(L, FuncTraits<Fn>::call(fn, args));
            return 1;
        }
        catch (const std::exception& e)
        {
            return luaL_error(L, e.what());
        }
    }